

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void AES_decrypt(uchar *in,uchar *out,AES_KEY *key)

{
  uchar *in_RCX;
  long lVar1;
  int iVar2;
  AES_state *round;
  AES_state s;
  
  s.slice[0] = 0;
  s.slice[1] = 0;
  s.slice[2] = 0;
  s.slice[3] = 0;
  s.slice[4] = 0;
  s.slice[5] = 0;
  s.slice[6] = 0;
  s.slice[7] = 0;
  LoadBytes(&s,in_RCX);
  lVar1 = ((ulong)out & 0xffffffff) * 0x10;
  AddRoundKey(&s,(AES_state *)(in + lVar1));
  round = (AES_state *)(in + lVar1);
  iVar2 = 1;
  while( true ) {
    round = round + -1;
    InvShiftRows(&s);
    SubBytes(&s,1);
    AddRoundKey(&s,round);
    if ((int)out <= iVar2) break;
    MixColumns(&s,1);
    iVar2 = iVar2 + 1;
  }
  SaveBytes((uchar *)key,&s);
  return;
}

Assistant:

static void AES_decrypt(const AES_state* rounds, int nrounds, unsigned char* plain16, const unsigned char* cipher16) {
    /* Most AES decryption implementations use the alternate scheme
     * (the Equivalent Inverse Cipher), which allows for more code reuse between
     * the encryption and decryption code, but requires separate setup for both.
     */
    AES_state s = {{0}};
    int round;

    rounds += nrounds;

    LoadBytes(&s, cipher16);
    AddRoundKey(&s, rounds--);

    for (round = 1; round < nrounds; round++) {
        InvShiftRows(&s);
        SubBytes(&s, 1);
        AddRoundKey(&s, rounds--);
        MixColumns(&s, 1);
    }

    InvShiftRows(&s);
    SubBytes(&s, 1);
    AddRoundKey(&s, rounds);

    SaveBytes(plain16, &s);
}